

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O3

void Cmd_addslotdefault(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  uint slot;
  char *pcVar2;
  PClass *p;
  PClassWeapon *type;
  PClassWeapon *pPVar3;
  FString FStack_28;
  FName local_1c;
  
  iVar1 = FCommandLine::argc(argv);
  if (iVar1 == 3) {
    pcVar2 = FCommandLine::operator[](argv,1);
    slot = atoi(pcVar2);
    if (slot < 10) {
      pcVar2 = FCommandLine::operator[](argv,2);
      local_1c.Index = FName::NameManager::FindName(&FName::NameData,pcVar2,true);
      p = PClass::FindClass(&local_1c);
      type = dyn_cast<PClassWeapon>((DObject *)p);
      if (type == (PClassWeapon *)0x0) {
        pcVar2 = FCommandLine::operator[](argv,2);
        Printf("%s is not a weapon\n",pcVar2);
      }
      else if (ParsingKeyConf == true) {
        FString::FString(&FStack_28,argv->cmd);
        TArray<FString,_FString>::Grow(&KeyConfWeapons,1);
        FString::AttachToOther(KeyConfWeapons.Array + KeyConfWeapons.Count,&FStack_28);
        KeyConfWeapons.Count = KeyConfWeapons.Count + 1;
        FString::~FString(&FStack_28);
      }
      else if (PlayingKeyConf == (FWeaponSlots *)0x0) {
        Net_WriteByte('7');
        Net_WriteByte((BYTE)slot);
        Net_WriteWeapon(type);
      }
      else {
        pPVar3 = type;
        if ((PClassWeapon *)AWeapon::RegistrationInfo.MyClass != type) {
          do {
            pPVar3 = (PClassWeapon *)
                     (pPVar3->super_PClassInventory).super_PClassActor.super_PClass.ParentClass;
            if (pPVar3 == (PClassWeapon *)AWeapon::RegistrationInfo.MyClass) break;
          } while (pPVar3 != (PClassWeapon *)0x0);
          if (pPVar3 == (PClassWeapon *)0x0) {
            return;
          }
        }
        FWeaponSlots::AddDefaultWeapon(PlayingKeyConf,slot,type);
      }
      return;
    }
  }
  Printf("Usage: addslotdefault <slot> <weapon>\n");
  return;
}

Assistant:

CCMD (addslotdefault)
{
	PClassWeapon *type;
	unsigned int slot;

	if (argv.argc() != 3 || (slot = atoi (argv[1])) >= NUM_WEAPON_SLOTS)
	{
		Printf ("Usage: addslotdefault <slot> <weapon>\n");
		return;
	}

	type = dyn_cast<PClassWeapon>(PClass::FindClass(argv[2]));
	if (type == NULL)
	{
		Printf ("%s is not a weapon\n", argv[2]);
		return;
	}

	if (ParsingKeyConf)
	{
		KeyConfWeapons.Push(argv.args());
	}
	else if (PlayingKeyConf != NULL)
	{
		PlayingKeyConf->AddSlotDefault(int(slot), type, false);
	}
	else
	{
		Net_WriteByte(DEM_ADDSLOTDEFAULT);
		Net_WriteByte(slot);
		Net_WriteWeapon(type);
	}
}